

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O1

void h2_pri_spec(Curl_easy *data,nghttp2_priority_spec *pri_spec)

{
  Curl_easy *pCVar1;
  HTTP *pHVar2;
  int32_t stream_id;
  
  pCVar1 = (data->set).stream_depends_on;
  stream_id = 0;
  if (pCVar1 == (Curl_easy *)0x0) {
    pHVar2 = (HTTP *)0x0;
  }
  else {
    pHVar2 = (pCVar1->req).p.http;
  }
  if (pHVar2 != (HTTP *)0x0) {
    stream_id = pHVar2->stream_id;
  }
  nghttp2_priority_spec_init
            (pri_spec,stream_id,(data->set).stream_weight,
             (uint)((ulong)*(undefined8 *)&(data->set).field_0x8e2 >> 0x2d) & 1);
  (data->state).stream_weight = (data->set).stream_weight;
  *(uint *)&(data->state).field_0x6d0 =
       *(uint *)&(data->state).field_0x6d0 & 0xffffefff |
       (uint)((ulong)*(undefined8 *)&(data->set).field_0x8e2 >> 0x21) & 0x1000;
  (data->state).stream_depends_on = (data->set).stream_depends_on;
  return;
}

Assistant:

static void h2_pri_spec(struct Curl_easy *data,
                        nghttp2_priority_spec *pri_spec)
{
  struct HTTP *depstream = (data->set.stream_depends_on?
                            data->set.stream_depends_on->req.p.http:NULL);
  int32_t depstream_id = depstream? depstream->stream_id:0;
  nghttp2_priority_spec_init(pri_spec, depstream_id, data->set.stream_weight,
                             data->set.stream_depends_e);
  data->state.stream_weight = data->set.stream_weight;
  data->state.stream_depends_e = data->set.stream_depends_e;
  data->state.stream_depends_on = data->set.stream_depends_on;
}